

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O3

void __thiscall
cbtAlignedObjectArray<cbtFace>::resize
          (cbtAlignedObjectArray<cbtFace> *this,int newsize,cbtFace *fillData)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  cbtFace *pcVar4;
  undefined8 uVar5;
  uint uVar6;
  cbtFace *pcVar7;
  long lVar8;
  int iVar9;
  
  uVar3 = this->m_size;
  iVar9 = uVar3 - newsize;
  if (iVar9 == 0 || (int)uVar3 < newsize) {
    if ((int)uVar3 < newsize) {
      if (this->m_capacity < newsize) {
        if (newsize == 0) {
          pcVar7 = (cbtFace *)0x0;
          uVar6 = uVar3;
        }
        else {
          pcVar7 = (cbtFace *)cbtAlignedAllocInternal((long)newsize * 0x30,0x10);
          uVar6 = this->m_size;
        }
        if (0 < (int)uVar6) {
          lVar8 = 0;
          do {
            pcVar4 = this->m_data;
            cbtAlignedObjectArray<int>::cbtAlignedObjectArray
                      ((cbtAlignedObjectArray<int> *)((long)pcVar7->m_plane + lVar8 + -0x20),
                       (cbtAlignedObjectArray<int> *)((long)pcVar4->m_plane + lVar8 + -0x20));
            puVar1 = (undefined8 *)((long)pcVar4->m_plane + lVar8);
            uVar5 = puVar1[1];
            puVar2 = (undefined8 *)((long)pcVar7->m_plane + lVar8);
            *puVar2 = *puVar1;
            puVar2[1] = uVar5;
            lVar8 = lVar8 + 0x30;
          } while ((ulong)uVar6 * 0x30 != lVar8);
          iVar9 = this->m_size;
          if (0 < (long)iVar9) {
            lVar8 = 0;
            do {
              cbtAlignedObjectArray<int>::~cbtAlignedObjectArray
                        ((cbtAlignedObjectArray<int> *)((long)this->m_data->m_plane + lVar8 + -0x20)
                        );
              lVar8 = lVar8 + 0x30;
            } while ((long)iVar9 * 0x30 != lVar8);
          }
        }
        if ((this->m_data != (cbtFace *)0x0) && (this->m_ownsMemory == true)) {
          cbtAlignedFreeInternal(this->m_data);
        }
        this->m_ownsMemory = true;
        this->m_data = pcVar7;
        this->m_capacity = newsize;
        if (newsize <= (int)uVar3) goto LAB_008d29eb;
      }
      lVar8 = (long)(int)uVar3 * 0x30;
      iVar9 = newsize - uVar3;
      do {
        pcVar7 = this->m_data;
        cbtAlignedObjectArray<int>::cbtAlignedObjectArray
                  ((cbtAlignedObjectArray<int> *)((long)pcVar7->m_plane + lVar8 + -0x20),
                   &fillData->m_indices);
        uVar5 = *(undefined8 *)(fillData->m_plane + 2);
        puVar1 = (undefined8 *)((long)pcVar7->m_plane + lVar8);
        *puVar1 = *(undefined8 *)fillData->m_plane;
        puVar1[1] = uVar5;
        lVar8 = lVar8 + 0x30;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
  }
  else {
    lVar8 = (long)newsize * 0x30;
    do {
      cbtAlignedObjectArray<int>::~cbtAlignedObjectArray
                ((cbtAlignedObjectArray<int> *)((long)this->m_data->m_plane + lVar8 + -0x20));
      lVar8 = lVar8 + 0x30;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
LAB_008d29eb:
  this->m_size = newsize;
  return;
}

Assistant:

SIMD_FORCE_INLINE void resize(int newsize, const T& fillData = T())
	{
		const int curSize = size();

		if (newsize < curSize)
		{
			for (int i = newsize; i < curSize; i++)
			{
				m_data[i].~T();
			}
		}
		else
		{
			if (newsize > curSize)
			{
				reserve(newsize);
			}
#ifdef BT_USE_PLACEMENT_NEW
			for (int i = curSize; i < newsize; i++)
			{
				new (&m_data[i]) T(fillData);
			}
#endif  //BT_USE_PLACEMENT_NEW
		}

		m_size = newsize;
	}